

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::testPipelineQueryPrograms
          (SeparateShaderTest *this,
          MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
          *pipeOut)

{
  CallLogWrapper *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  GLint GVar2;
  _Alloc_hider _Var3;
  GLenum GVar4;
  int iVar5;
  ProgramWrapper *pPVar6;
  _Alloc_hider _Var7;
  GLint queryFrg;
  GLint queryVtx;
  ProgramParams pipePp;
  GLint local_6c;
  string local_68;
  GLuint local_48;
  GLint local_44;
  ProgramParams local_40;
  
  local_40 = genProgramParams(&this->m_rnd);
  createPipeline((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
                  *)&local_68,this,&local_40);
  _Var3._M_p = local_68._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)0x0;
  _Var7._M_p = (pointer)(pipeOut->
                        super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
                        ).m_data.ptr;
  if (_Var7._M_p != _Var3._M_p) {
    de::details::
    UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
    ::reset(&pipeOut->
             super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
           );
    (pipeOut->
    super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
    ).m_data.ptr = (Pipeline *)_Var3._M_p;
    _Var7._M_p = _Var3._M_p;
  }
  de::details::
  UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  ::reset((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
           *)&local_68);
  local_48 = *(GLuint *)
              ((long)(((Pipeline *)_Var7._M_p)->pipeline).
                     super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
                     .m_data.ptr + 8);
  local_44 = 0;
  local_6c = 0;
  this_00 = &this->super_CallLogWrapper;
  (this->super_CallLogWrapper).m_enableLog = true;
  glu::CallLogWrapper::glGetProgramPipelineiv(this_00,local_48,0x8b31,&local_44);
  GVar4 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar4,"glGetProgramPipelineiv(pipeName, GL_VERTEX_SHADER, &queryVtx)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSeparateShaderTests.cpp"
                  ,0x5b9);
  GVar2 = local_44;
  (this->super_CallLogWrapper).m_enableLog = false;
  pPVar6 = (((Pipeline *)_Var7._M_p)->vtxProg).
           super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
           .m_data.ptr;
  if (pPVar6 == (ProgramWrapper *)0x0) {
    pPVar6 = (((Pipeline *)_Var7._M_p)->fullProg).
             super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             .m_data.ptr;
  }
  iVar5 = (*pPVar6->_vptr_ProgramWrapper[2])();
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"Program pipeline query reported wrong vertex shader program","");
  tcu::ResultCollector::check(&this->m_status,GVar2 == iVar5,&local_68);
  paVar1 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  (this->super_CallLogWrapper).m_enableLog = true;
  glu::CallLogWrapper::glGetProgramPipelineiv(this_00,local_48,0x8b30,&local_6c);
  GVar4 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar4,"glGetProgramPipelineiv(pipeName, GL_FRAGMENT_SHADER, &queryFrg)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSeparateShaderTests.cpp"
                  ,0x5bd);
  GVar2 = local_6c;
  (this->super_CallLogWrapper).m_enableLog = false;
  pPVar6 = (((Pipeline *)_Var7._M_p)->frgProg).
           super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
           .m_data.ptr;
  if (pPVar6 == (ProgramWrapper *)0x0) {
    pPVar6 = (((Pipeline *)_Var7._M_p)->fullProg).
             super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             .m_data.ptr;
  }
  iVar5 = (*pPVar6->_vptr_ProgramWrapper[2])();
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"Program pipeline query reported wrong fragment shader program","")
  ;
  tcu::ResultCollector::check(&this->m_status,GVar2 == iVar5,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SeparateShaderTest::testPipelineQueryPrograms (MovePtr<Pipeline>& pipeOut)
{
	ProgramParams				pipePp		= genProgramParams(m_rnd);
	Pipeline&					pipeline	= *(pipeOut = createPipeline(pipePp));
	GLuint						pipeName	= pipeline.pipeline->getPipeline();
	GLint						queryVtx	= 0;
	GLint						queryFrg	= 0;

	LOG_CALL(GLU_CHECK_CALL(glGetProgramPipelineiv(pipeName, GL_VERTEX_SHADER, &queryVtx)));
	m_status.check(GLuint(queryVtx) == pipeline.getVertexProgram().getProgramName(),
				   "Program pipeline query reported wrong vertex shader program");

	LOG_CALL(GLU_CHECK_CALL(glGetProgramPipelineiv(pipeName, GL_FRAGMENT_SHADER, &queryFrg)));
	m_status.check(GLuint(queryFrg) == pipeline.getFragmentProgram().getProgramName(),
				   "Program pipeline query reported wrong fragment shader program");
}